

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svo_bitset.cc
# Opt level: O1

void __thiscall gss::innards::SVOBitset::SVOBitset(SVOBitset *this,uint size,uint bits)

{
  undefined1 auVar1 [64];
  long lVar2;
  BitWord *pBVar3;
  ulong uVar4;
  undefined1 auVar5 [64];
  
  this->n_words = size + 0x3f >> 6;
  if (size + 0x3f < 0x440) {
    auVar5 = vpbroadcastq_avx512f();
    lVar2 = 0;
    do {
      auVar1 = vmovdqu64_avx512f(auVar5);
      *(undefined1 (*) [64])((long)&this->_data + lVar2 * 8) = auVar1;
      lVar2 = lVar2 + 8;
    } while (lVar2 != 0x10);
  }
  else {
    pBVar3 = (BitWord *)operator_new__((ulong)size * 8);
    (this->_data).long_data = pBVar3;
    if (size != 0) {
      uVar4 = 0;
      do {
        (this->_data).long_data[uVar4] = (ulong)bits;
        uVar4 = uVar4 + 1;
      } while (size != uVar4);
    }
  }
  return;
}

Assistant:

SVOBitset::SVOBitset(unsigned size, unsigned bits)
{
    n_words = (size + bits_per_word - 1) / (bits_per_word);
    if (n_words <= svo_size) {
        for (unsigned i = 0; i < svo_size; ++i)
            _data.short_data[i] = bits;
    }
    else {
        _data.long_data = new BitWord[size];
        for (unsigned i = 0; i < size; ++i)
            _data.long_data[i] = bits;
    }
}